

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O1

BasicBlock * __thiscall spvtools::opt::BasicBlock::Clone(BasicBlock *this,IRContext *context)

{
  mapped_type pBVar1;
  Instruction *pIVar2;
  Instruction *node;
  mapped_type *ppBVar3;
  Instruction *inst;
  Instruction *pIVar4;
  Instruction *inst_1;
  Instruction *pIVar5;
  Instruction *local_38;
  
  pBVar1 = (mapped_type)operator_new(0x88);
  pIVar2 = Instruction::Clone((this->label_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl,context);
  pBVar1->function_ = (Function *)0x0;
  (pBVar1->label_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar2;
  pIVar2 = &(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_003e9ae0;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
       (IRContext *)0x0;
  *(undefined8 *)
   ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ + 6)
       = 0;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
  lexical_scope_ = 0;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.inlined_at_
       = 0;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar2;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar2;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
  (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
       (_func_int **)&PTR__InstructionList_003e9b78;
  pIVar4 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pIVar5 = &(this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar4 != pIVar5) {
    do {
      node = Instruction::Clone(pIVar4,context);
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>,node);
      pIVar4 = (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar4 != pIVar5);
  }
  if (((context->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) &&
     (pIVar4 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_, pIVar4 != pIVar2)) {
    do {
      if ((context->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        local_38 = pIVar4;
        ppBVar3 = std::__detail::
                  _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&context->instr_to_block_,&local_38);
        *ppBVar3 = pBVar1;
      }
      pIVar4 = (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar4 != pIVar2);
  }
  return pBVar1;
}

Assistant:

BasicBlock* BasicBlock::Clone(IRContext* context) const {
  BasicBlock* clone = new BasicBlock(
      std::unique_ptr<Instruction>(GetLabelInst()->Clone(context)));
  for (const auto& inst : insts_) {
    // Use the incoming context
    clone->AddInstruction(std::unique_ptr<Instruction>(inst.Clone(context)));
  }

  if (context->AreAnalysesValid(
          IRContext::Analysis::kAnalysisInstrToBlockMapping)) {
    for (auto& inst : *clone) {
      context->set_instr_block(&inst, clone);
    }
  }

  return clone;
}